

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

void assert_consistency(quicly_conn_t *conn,int timer_must_be_in_future)

{
  if ((conn->super).state < QUICLY_STATE_CLOSING) {
    if (((conn->egress).loss.sentmap.bytes_in_flight == 0) &&
       (((uint)(conn->super).remote.address_validation & 2) == 0)) {
      if ((conn->egress).loss.loss_time != 0x7fffffffffffffff) {
        __assert_fail("conn->egress.loss.loss_time == INT64_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x2ea,"void assert_consistency(quicly_conn_t *, int)");
      }
    }
    else if ((conn->egress).loss.alarm_at == 0x7fffffffffffffff) {
      __assert_fail("conn->egress.loss.alarm_at != INT64_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x2e8,"void assert_consistency(quicly_conn_t *, int)");
    }
    if (((timer_must_be_in_future != 0) &&
        (((uint)(conn->super).remote.address_validation & 1) != 0)) &&
       ((conn->egress).loss.alarm_at <= (conn->stash).now)) {
      __assert_fail("conn->stash.now < conn->egress.loss.alarm_at",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x2ef,"void assert_consistency(quicly_conn_t *, int)");
    }
  }
  else if ((timer_must_be_in_future != 0) && ((conn->egress).send_ack_at <= (conn->stash).now)) {
    __assert_fail("!timer_must_be_in_future || conn->stash.now < conn->egress.send_ack_at",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x2e3,"void assert_consistency(quicly_conn_t *, int)");
  }
  return;
}

Assistant:

static void assert_consistency(quicly_conn_t *conn, int timer_must_be_in_future)
{
    if (conn->super.state >= QUICLY_STATE_CLOSING) {
        assert(!timer_must_be_in_future || conn->stash.now < conn->egress.send_ack_at);
        return;
    }

    if (conn->egress.loss.sentmap.bytes_in_flight != 0 || conn->super.remote.address_validation.send_probe) {
        assert(conn->egress.loss.alarm_at != INT64_MAX);
    } else {
        assert(conn->egress.loss.loss_time == INT64_MAX);
    }
    /* Allow timers not in the future when the remote peer is not yet validated, since we may not be able to send packets even when
     * timers fire. */
    if (timer_must_be_in_future && conn->super.remote.address_validation.validated)
        assert(conn->stash.now < conn->egress.loss.alarm_at);
}